

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O2

void __thiscall AnalyserUnits_piecewise_Test::TestBody(AnalyserUnits_piecewise_Test *this)

{
  long lVar1;
  char *pcVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_153;
  allocator_type local_135;
  allocator<char> local_134;
  allocator<char> local_133;
  allocator<char> local_132;
  allocator<char> local_131;
  unsigned_long local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  ModelPtr model;
  ParserPtr parser;
  AnalyserPtr analyser;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedIssues,"analyser/units/piecewise.cellml",
             (allocator<char> *)&local_130);
  fileContents((string *)&analyser);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::~string((string *)&expectedIssues);
  expectedIssues.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_130 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&analyser,"size_t(0)","parser->issueCount()",
             (unsigned_long *)&expectedIssues,&local_130);
  if ((char)analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&expectedIssues);
    if (analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)analyser.
                         super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_130,(Message *)&expectedIssues);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&expectedIssues);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,
             "The units in \'b > 9.0\' in \'(b > 9.0)?7.0\' in \'(b > 9.0)?7.0:11.0\' in equation \'b = (b > 9.0)?7.0:11.0\' in component \'main\' are not equivalent. \'b\' is \'dimensionless\' while \'9.0\' is in \'second\'."
             ,(allocator<char> *)&local_130);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,
             "The units in \'c > 15.0\' in \'(c > 15.0)?13.0\' in \'(c > 15.0)?13.0:17.0\' in equation \'c = (c > 15.0)?13.0:17.0\' in component \'main\' are not equivalent. \'c\' is \'dimensionless\' while \'15.0\' is in \'volt\' (i.e. \'ampere^-1 x kilogram x metre^2 x second^-3\')."
             ,(allocator<char> *)&gtest_trace_153);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,
             "The units in \'d > 21.0\' in \'(d > 21.0)?19.0\' in \'(d > 21.0)?19.0:23.0\' in equation \'d = (d > 21.0)?19.0:23.0\' in component \'main\' are not equivalent. \'d\' is \'dimensionless\' while \'21.0\' is in \'frog\'."
             ,&local_131);
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,
             "The units in \'e > 27.0\' in \'(e > 27.0)?25.0\' in \'(e > 27.0)?25.0:29.0\' in equation \'e = (e > 27.0)?25.0:29.0\' in component \'main\' are not equivalent. \'e\' is \'dimensionless\' while \'27.0\' is in \'imaginary\' (i.e. \'10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16\')."
             ,&local_132);
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,
             "The units in \'f = (f > 33.0)?31.0:(f > 37.0)?35.0:(f > 41.0)?39.0:(f > 45.0)?43.0:(f > 49.0)?47.0:51.0\' in component \'main\' are not equivalent. \'f\' is \'dimensionless\' while \'(f > 33.0)?31.0:(f > 37.0)?35.0:(f > 41.0)?39.0:(f > 45.0)?43.0:(f > 49.0)?47.0:51.0\' is in \'second\', \'volt\', \'frog\' and \'imaginary\' (i.e. \'second\', \'ampere^-1 x kilogram x metre^2 x second^-3\', \'frog\' and \'10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16\')."
             ,&local_133);
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,
             "The unit of \'55.0\' in \'(55.0)?53.0\' in \'(55.0)?53.0:57.0\' in equation \'g = (55.0)?53.0:57.0\' in component \'main\' is not dimensionless. \'55.0\' is in \'second\'."
             ,&local_134);
  __l._M_len = 6;
  __l._M_array = (iterator)&analyser;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expectedIssues,__l,&local_135);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel
            ((shared_ptr *)
             CONCAT71(analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._1_7_,
                      (char)analyser.
                            super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr));
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_153,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
             ,0x99,"Issue occurred here.");
  std::__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Analyser,void>
            ((__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2> *)&local_130,
             &analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>);
  expectEqualIssues((vector *)&expectedIssues,(shared_ptr *)&local_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_153);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expectedIssues);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(AnalyserUnits, piecewise)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("analyser/units/piecewise.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "The units in 'b > 9.0' in '(b > 9.0)?7.0' in '(b > 9.0)?7.0:11.0' in equation 'b = (b > 9.0)?7.0:11.0' in component 'main' are not equivalent. 'b' is 'dimensionless' while '9.0' is in 'second'.",
        "The units in 'c > 15.0' in '(c > 15.0)?13.0' in '(c > 15.0)?13.0:17.0' in equation 'c = (c > 15.0)?13.0:17.0' in component 'main' are not equivalent. 'c' is 'dimensionless' while '15.0' is in 'volt' (i.e. 'ampere^-1 x kilogram x metre^2 x second^-3').",
        "The units in 'd > 21.0' in '(d > 21.0)?19.0' in '(d > 21.0)?19.0:23.0' in equation 'd = (d > 21.0)?19.0:23.0' in component 'main' are not equivalent. 'd' is 'dimensionless' while '21.0' is in 'frog'.",
        "The units in 'e > 27.0' in '(e > 27.0)?25.0' in '(e > 27.0)?25.0:29.0' in equation 'e = (e > 27.0)?25.0:29.0' in component 'main' are not equivalent. 'e' is 'dimensionless' while '27.0' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16').",
        "The units in 'f = (f > 33.0)?31.0:(f > 37.0)?35.0:(f > 41.0)?39.0:(f > 45.0)?43.0:(f > 49.0)?47.0:51.0' in component 'main' are not equivalent. 'f' is 'dimensionless' while '(f > 33.0)?31.0:(f > 37.0)?35.0:(f > 41.0)?39.0:(f > 45.0)?43.0:(f > 49.0)?47.0:51.0' is in 'second', 'volt', 'frog' and 'imaginary' (i.e. 'second', 'ampere^-1 x kilogram x metre^2 x second^-3', 'frog' and '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16').",
        "The unit of '55.0' in '(55.0)?53.0' in '(55.0)?53.0:57.0' in equation 'g = (55.0)?53.0:57.0' in component 'main' is not dimensionless. '55.0' is in 'second'.",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, analyser);
}